

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::setStyle_helper(QWidgetPrivate *this,QStyle *newStyle,bool propagate)

{
  long lVar1;
  WindowType WVar2;
  QWidget *pQVar3;
  QStyle *pQVar4;
  qsizetype qVar5;
  QWidget *pQVar6;
  QStyleSheetStyle *pQVar7;
  byte in_DL;
  QStyleSheetStyle *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetStyle *proxy;
  QStyleSheetStyle *cssStyle;
  QWidget *c;
  int i;
  QStyle *oldStyle;
  QWidget *q;
  QEvent e;
  QObjectList childrenList;
  QPointer<QStyle> origStyle;
  QWidget *in_stack_ffffffffffffff58;
  QWidgetPrivate *in_stack_ffffffffffffff60;
  int local_6c;
  undefined1 *local_40;
  undefined1 *local_38;
  Data *local_30;
  QWidgetPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  pQVar4 = QWidget::style(in_stack_ffffffffffffff58);
  createExtra(in_stack_ffffffffffffff60);
  std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x367ac7);
  QPointer<QStyle>::QPointer
            ((QPointer<QStyle> *)in_stack_ffffffffffffff60,
             (QPointer<QStyle> *)in_stack_ffffffffffffff58);
  std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x367af3);
  QPointer<QStyle>::operator=
            ((QPointer<QStyle> *)in_stack_ffffffffffffff60,(QStyle *)in_stack_ffffffffffffff58);
  if ((in_RDI->polished != (QMetaObject *)0x0) &&
     (WVar2 = QWidget::windowType((QWidget *)in_stack_ffffffffffffff60), WVar2 != Desktop)) {
    (**(code **)(*(long *)pQVar4 + 0x68))(pQVar4,pQVar3);
    pQVar4 = QWidget::style(in_stack_ffffffffffffff58);
    (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,pQVar3);
  }
  if ((in_DL & 1) != 0) {
    local_30 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QWidgetPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QObject_*>::QList
              ((QList<QObject_*> *)in_stack_ffffffffffffff60,
               (QList<QObject_*> *)in_stack_ffffffffffffff58);
    local_6c = 0;
    while( true ) {
      in_stack_ffffffffffffff60 = (QWidgetPrivate *)(long)local_6c;
      qVar5 = QList<QObject_*>::size((QList<QObject_*> *)&local_30);
      if (qVar5 <= (long)in_stack_ffffffffffffff60) break;
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58)
      ;
      pQVar6 = qobject_cast<QWidget*>(&in_stack_ffffffffffffff58->super_QObject);
      if (pQVar6 != (QWidget *)0x0) {
        QWidget::d_func((QWidget *)0x367be9);
        inheritStyle(this_00);
      }
      local_6c = local_6c + 1;
    }
    QList<QObject_*>::~QList((QList<QObject_*> *)0x367c0a);
  }
  pQVar7 = qt_styleSheet((QStyle *)0x367c14);
  if (pQVar7 == (QStyleSheetStyle *)0x0) {
    ::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x367c27);
    pQVar7 = qt_styleSheet((QStyle *)0x367c2f);
    if (pQVar7 != (QStyleSheetStyle *)0x0) {
      QStyleSheetStyle::clearWidgetFont(in_RSI,(QWidget *)in_stack_ffffffffffffff60);
    }
  }
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_40,StyleChange);
  QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_40);
  ::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x367c90);
  pQVar7 = qt_styleSheet((QStyle *)0x367c98);
  if (pQVar7 != (QStyleSheetStyle *)0x0) {
    QStyleSheetStyle::deref((QStyleSheetStyle *)in_stack_ffffffffffffff60);
  }
  QEvent::~QEvent((QEvent *)&local_40);
  QPointer<QStyle>::~QPointer((QPointer<QStyle> *)0x367cc6);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setStyle_helper(QStyle *newStyle, bool propagate)
{
    Q_Q(QWidget);
    QStyle *oldStyle = q->style();

    createExtra();

#ifndef QT_NO_STYLE_STYLESHEET
    QPointer<QStyle> origStyle = extra->style;
#endif
    extra->style = newStyle;

    // repolish
    if (polished && q->windowType() != Qt::Desktop) {
        oldStyle->unpolish(q);
        q->style()->polish(q);
    }

    if (propagate) {
        // We copy the list because the order may be modified
        const QObjectList childrenList = children;
        for (int i = 0; i < childrenList.size(); ++i) {
            QWidget *c = qobject_cast<QWidget*>(childrenList.at(i));
            if (c)
                c->d_func()->inheritStyle();
        }
    }

#ifndef QT_NO_STYLE_STYLESHEET
    if (!qt_styleSheet(newStyle)) {
        if (const QStyleSheetStyle* cssStyle = qt_styleSheet(origStyle)) {
            cssStyle->clearWidgetFont(q);
        }
    }
#endif

    QEvent e(QEvent::StyleChange);
    QCoreApplication::sendEvent(q, &e);

#ifndef QT_NO_STYLE_STYLESHEET
    // dereference the old stylesheet style
    if (QStyleSheetStyle *proxy = qt_styleSheet(origStyle))
        proxy->deref();
#endif
}